

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresultstore.cpp
# Opt level: O3

bool __thiscall QtPrivate::ResultStoreBase::containsValidResultItem(ResultStoreBase *this,int index)

{
  const_iterator _mapIterator;
  long lVar1;
  long in_FS_OFFSET;
  bool bVar2;
  ResultIteratorBase RVar3;
  ResultIteratorBase local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = 0x20;
  if (index <= this->insertIndex) {
    lVar1 = 8;
  }
  if (this->m_filterMode == false) {
    lVar1 = 8;
  }
  if (index == -1) {
    lVar1 = 8;
  }
  RVar3 = findResult(*(QMap<int,_QtPrivate::ResultItem> **)
                      ((long)&this->_vptr_ResultStoreBase + lVar1),index);
  lVar1 = *(long *)((long)&this->_vptr_ResultStoreBase + lVar1);
  _mapIterator._M_node = (_Base_ptr)(lVar1 + 0x10);
  if (lVar1 == 0) {
    _mapIterator._M_node = (_Base_ptr)0x0;
  }
  bVar2 = false;
  ResultIteratorBase::ResultIteratorBase(&local_40,(const_iterator)_mapIterator._M_node,0);
  if ((RVar3.mapIterator.i._M_node.i != local_40.mapIterator.i._M_node) ||
     (RVar3.m_vectorIndex != local_40.m_vectorIndex)) {
    bVar2 = *(long *)((long)RVar3.mapIterator.i._M_node.i + 0x30) != 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool ResultStoreBase::containsValidResultItem(int index) const
{
    // index might refer to either visible or pending result
    const bool inPending = m_filterMode && index != -1 && index > insertIndex;
    const auto &store = inPending ? pendingResults : m_results;
    auto it = findResult(store, index);
    return it != ResultIteratorBase(store.end()) && it.isValid();
}